

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# powerset.h
# Opt level: O0

bool __thiscall
wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>::join
          (FinitePowersetLattice<wasm::LocalSet_*> *this,Element *joinee,Element *joiner)

{
  bool bVar1;
  Element *joiner_local;
  Element *joinee_local;
  FinitePowersetLattice<wasm::LocalSet_*> *this_local;
  
  bVar1 = FiniteIntPowersetLattice::join(&this->intLattice,joinee,joiner);
  return bVar1;
}

Assistant:

bool join(Element& joinee, const Element& joiner) const noexcept {
    return intLattice.join(joinee, joiner);
  }